

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# membrane.c++
# Opt level: O0

Maybe<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_> __thiscall
capnp::MembraneHook::whenMoreResolved(MembraneHook *this)

{
  SourceLocation location;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2 other;
  ClientHook *pCVar1;
  NullableValue<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_> *other_00;
  Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_> *pPVar2;
  MembranePolicy *pMVar3;
  NullableValue<kj::Promise<void>_> *other_01;
  Promise<void> *pPVar4;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_>_2
  extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_>_2
  extraout_RDX_00;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_>_2
  aVar5;
  long in_RSI;
  Maybe<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_> MVar6;
  Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_> local_e0 [2];
  SourceLocation local_d0;
  Promise<void> local_b0;
  Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_> local_a8;
  Type *local_a0;
  Promise<void> *r_1;
  undefined1 local_88 [8];
  NullableValue<kj::Promise<void>_> _r504;
  Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_> *promise;
  undefined1 local_60 [8];
  NullableValue<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_> _promise503;
  FixVoid<kj::Own<capnp::ClientHook>_> local_40;
  Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_> local_30;
  Own<capnp::ClientHook,_std::nullptr_t> *local_28;
  Own<capnp::ClientHook,_std::nullptr_t> *r;
  Own<capnp::ClientHook,_std::nullptr_t> *_r499;
  MembraneHook *this_local;
  
  this_local = this;
  local_28 = kj::_::readMaybe<capnp::ClientHook,decltype(nullptr)>
                       ((Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_> *)(in_RSI + 0x48));
  r = local_28;
  if (local_28 == (Own<capnp::ClientHook,_std::nullptr_t> *)0x0) {
    pCVar1 = kj::Own<capnp::ClientHook,_std::nullptr_t>::operator->
                       ((Own<capnp::ClientHook,_std::nullptr_t> *)(in_RSI + 0x20));
    (*pCVar1->_vptr_ClientHook[3])();
    other_00 = kj::_::readMaybe<kj::Promise<kj::Own<capnp::ClientHook,decltype(nullptr)>>>
                         ((Maybe<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_> *)
                          &promise);
    kj::_::NullableValue<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_>::NullableValue
              ((NullableValue<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_> *)local_60,
               other_00);
    kj::Maybe<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_>::~Maybe
              ((Maybe<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_> *)&promise);
    pPVar2 = kj::_::NullableValue::operator_cast_to_Promise_((NullableValue *)local_60);
    if (pPVar2 == (Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_> *)0x0) {
      kj::Maybe<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_>::Maybe
                ((Maybe<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_> *)this);
    }
    else {
      _r504.field_1 =
           (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2)
           kj::_::NullableValue<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_>::
           operator*((NullableValue<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_> *)
                     local_60);
      pMVar3 = kj::Own<capnp::MembranePolicy,_std::nullptr_t>::operator->
                         ((Own<capnp::MembranePolicy,_std::nullptr_t> *)(in_RSI + 0x30));
      (*pMVar3->_vptr_MembranePolicy[3])(&r_1);
      other_01 = kj::_::readMaybe<kj::Promise<void>>((Maybe<kj::Promise<void>_> *)&r_1);
      kj::_::NullableValue<kj::Promise<void>_>::NullableValue
                ((NullableValue<kj::Promise<void>_> *)local_88,other_01);
      kj::Maybe<kj::Promise<void>_>::~Maybe((Maybe<kj::Promise<void>_> *)&r_1);
      pPVar4 = kj::_::NullableValue::operator_cast_to_Promise_((NullableValue *)local_88);
      if (pPVar4 != (Promise<void> *)0x0) {
        local_a0 = (Type *)kj::_::NullableValue<kj::Promise<void>_>::operator*
                                     ((NullableValue<kj::Promise<void>_> *)local_88);
        other = _r504.field_1;
        kj::Promise<void>::then<capnp::MembraneHook::whenMoreResolved()::_lambda()_1_>
                  (&local_b0,local_a0);
        kj::SourceLocation::SourceLocation
                  (&local_d0,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/membrane.c++"
                   ,"whenMoreResolved",0x1f9,0x13);
        location.function = local_d0.function;
        location.fileName = local_d0.fileName;
        location.lineNumber = local_d0.lineNumber;
        location.columnNumber = local_d0.columnNumber;
        kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>::exclusiveJoin
                  (&local_a8,(Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_> *)other,location)
        ;
        kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>::operator=
                  ((Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_> *)_r504.field_1,&local_a8);
        kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>::~Promise(&local_a8);
        kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>::~Promise
                  ((Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_> *)&local_b0);
      }
      kj::_::NullableValue<kj::Promise<void>_>::~NullableValue
                ((NullableValue<kj::Promise<void>_> *)local_88);
      kj::Promise<kj::Own<capnp::ClientHook,decltype(nullptr)>>::
      then<capnp::MembraneHook::whenMoreResolved()::_lambda(kj::Own<capnp::ClientHook,decltype(nullptr)>&&)_1_>
                ((Promise<kj::Own<capnp::ClientHook,decltype(nullptr)>> *)local_e0,
                 (Type *)_r504.field_1);
      kj::Maybe<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_>::Maybe
                ((Maybe<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_> *)this,local_e0);
      kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>::~Promise(local_e0);
    }
    kj::_::NullableValue<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_>::~NullableValue
              ((NullableValue<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_> *)local_60)
    ;
    aVar5 = extraout_RDX_00;
  }
  else {
    pCVar1 = kj::Own<capnp::ClientHook,_std::nullptr_t>::get(local_28);
    (*pCVar1->_vptr_ClientHook[4])();
    kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>::Promise(&local_30,&local_40);
    kj::Maybe<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_>::Maybe
              ((Maybe<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_> *)this,&local_30);
    kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>::~Promise(&local_30);
    kj::Own<capnp::ClientHook,_std::nullptr_t>::~Own(&local_40);
    aVar5 = extraout_RDX;
  }
  MVar6.ptr.field_1 = aVar5;
  MVar6.ptr._0_8_ = this;
  return (Maybe<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_>)MVar6.ptr;
}

Assistant:

kj::Maybe<kj::Promise<kj::Own<ClientHook>>> whenMoreResolved() override {
    KJ_IF_SOME(r, resolved) {
      return kj::Promise<kj::Own<ClientHook>>(r.get()->addRef());
    }

    KJ_IF_SOME(promise, inner->whenMoreResolved()) {
      KJ_IF_SOME(r, policy->onRevoked()) {
        promise = promise.exclusiveJoin(r.then([]() -> kj::Own<ClientHook> {
          KJ_FAIL_REQUIRE("onRevoked() promise resolved; it should only reject");
        }));
      }

      return promise.then([this](kj::Own<ClientHook>&& newInner) {
        // There's a chance resolved was set by getResolved() or a concurrent whenMoreResolved()
        // while we yielded the event loop. If the inner ClientHook is maintaining the contract,
        // then resolved would already be set to newInner after wrapping in a MembraneHook.
        KJ_IF_SOME(r, resolved) {
          return r->addRef();
        } else {
          return resolved.emplace(wrap(*newInner, *policy, reverse))->addRef();
        }
      });
    } else {
      return kj::none;
    }
  }